

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O1

bool __thiscall
miniros::Subscription::addCallback
          (Subscription *this,SubscriptionCallbackHelperPtr *helper,string *md5sum,
          CallbackQueueInterface *queue,int32_t queue_size,VoidConstPtr *tracked_object,
          bool allow_concurrent_callbacks)

{
  _Rb_tree_header *p_Var1;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Base_ptr p_Var3;
  CallbackQueueInterface *pCVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  int iVar8;
  string *psVar9;
  _Base_ptr p_Var10;
  pthread_mutex_t *__mutex;
  pointer psVar11;
  _Rb_tree_header *p_Var12;
  pointer psVar13;
  bool was_full;
  bool allow_concurrent_callbacks_local;
  undefined4 local_b4;
  pthread_mutex_t *local_b0;
  CallbackInfoPtr info;
  shared_ptr<miniros::MessageDeserializer> des;
  int32_t queue_size_local;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  pthread_mutex_t *local_60;
  pointer local_58;
  string local_50;
  
  allow_concurrent_callbacks_local = allow_concurrent_callbacks;
  queue_size_local = queue_size;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->md5sum_mutex_);
  if (iVar7 != 0) goto LAB_0020f2ec;
  iVar7 = std::__cxx11::string::compare((char *)&this->md5sum_);
  if ((iVar7 == 0) && (iVar7 = std::__cxx11::string::compare((char *)md5sum), iVar7 != 0)) {
    std::__cxx11::string::_M_assign((string *)&this->md5sum_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->md5sum_mutex_);
  iVar7 = std::__cxx11::string::compare((char *)md5sum);
  if (iVar7 == 0) {
LAB_0020ef7c:
    local_b4 = 0;
  }
  else {
    psVar9 = md5sum_abi_cxx11_(&local_50,this);
    __n = md5sum->_M_string_length;
    local_b4 = (undefined4)CONCAT71((int7)((ulong)psVar9 >> 8),1);
    if (__n == local_50._M_string_length) {
      if (__n == 0) goto LAB_0020ef7c;
      iVar8 = bcmp((md5sum->_M_dataplus)._M_p,local_50._M_dataplus._M_p,__n);
      local_b4 = CONCAT31((int3)((uint)iVar8 >> 8),iVar8 != 0);
    }
  }
  if ((iVar7 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_b4 == '\0') {
    __mutex = (pthread_mutex_t *)&this->callbacks_mutex_;
    iVar7 = pthread_mutex_lock(__mutex);
    if (iVar7 != 0) {
LAB_0020f2ec:
      std::__throw_system_error(iVar7);
    }
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count = 1;
    (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_weak_count = 1;
    (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_002ace50;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_use_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_weak_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_use_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_weak_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_use_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._M_weak_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_use_count = 0;
    info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[4]._M_weak_count = 0;
    *(element_type **)
     &info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count =
         (helper->
         super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               (info.
                super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 2),
               &(helper->
                super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount);
    (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->callback_queue_ = queue;
    des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<miniros::SubscriptionQueue,std::allocator<miniros::SubscriptionQueue>,std::__cxx11::string&,int&,bool&>
              (&des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(SubscriptionQueue **)&des,
               (allocator<miniros::SubscriptionQueue> *)&local_70,&this->name_,&queue_size_local,
               &allow_concurrent_callbacks_local);
    std::__shared_ptr<miniros::SubscriptionQueue,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<miniros::SubscriptionQueue,miniros::SubscriptionQueue>
              ((__shared_ptr<miniros::SubscriptionQueue,(__gnu_cxx::_Lock_policy)2> *)&des,
               (SubscriptionQueue *)
               des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    _Var6 = des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    peVar5 = des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = ((info.
                super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->subscription_queue_).
              super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    ((info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->subscription_queue_).
    super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)peVar5;
    ((info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->subscription_queue_).
    super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var6._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ((info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((info.
                  super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->has_tracked_object_ = false;
    (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->has_tracked_object_ =
         (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
         (element_type *)0x0;
    iVar7 = (*((helper->
               super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_SubscriptionCallbackHelper[5])();
    if ((char)iVar7 == '\0') {
      this->nonconst_callbacks_ = this->nonconst_callbacks_ + 1;
    }
    std::
    vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
    ::push_back(&this->callbacks_,&info);
    std::
    vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
    ::reserve(&this->cached_deserializers_,
              (long)(this->callbacks_).
                    super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->callbacks_).
                    super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    if ((this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_60 = (pthread_mutex_t *)&this->publisher_links_mutex_;
      local_b0 = __mutex;
      iVar7 = pthread_mutex_lock(local_60);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      psVar13 = (this->publisher_links_).
                super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar11 = (this->publisher_links_).
                super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar13 != psVar11) {
        p_Var1 = &(this->latched_messages_)._M_t._M_impl.super__Rb_tree_header;
        local_58 = psVar11;
        do {
          peVar2 = (psVar13->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          if (peVar2->latched_ == true) {
            p_Var3 = (this->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var10 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
                p_Var3 = (&p_Var3->_M_left)[*(element_type **)(p_Var3 + 1) < peVar2]) {
              if (*(element_type **)(p_Var3 + 1) >= peVar2) {
                p_Var10 = p_Var3;
              }
            }
            p_Var12 = p_Var1;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var12 = (_Rb_tree_header *)p_Var10,
               peVar2 < (element_type *)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
              p_Var12 = p_Var1;
            }
            if (p_Var12 != p_Var1) {
              des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<miniros::MessageDeserializer,std::allocator<miniros::MessageDeserializer>,std::shared_ptr<miniros::SubscriptionCallbackHelper>const&,miniros::SerializedMessage_const&,std::shared_ptr<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>const&>
                        (&des.
                          super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,(MessageDeserializer **)&des,
                         (allocator<miniros::MessageDeserializer> *)&local_70,helper,
                         (SerializedMessage *)((long)(p_Var12 + 1) + 8),
                         (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)(p_Var12 + 3));
              was_full = false;
              SubscriptionQueue::push
                        (((info.
                           super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->subscription_queue_).
                         super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,&(info.
                                  super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->helper_,&des,
                         (info.
                          super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->has_tracked_object_,
                         &(info.
                           super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->tracked_object_,true,
                         (Time)*(TimeBase<miniros::Time,_miniros::Duration> *)
                                ((long)(p_Var12 + 3) + 0x10),&was_full);
              if (was_full == false) {
                pCVar4 = (info.
                          super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->callback_queue_;
                local_70 = ((info.
                             super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->subscription_queue_).
                           super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                local_68 = ((info.
                             super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->subscription_queue_).
                           super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_68->_M_use_count = local_68->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_68->_M_use_count = local_68->_M_use_count + 1;
                  }
                }
                (*pCVar4->_vptr_CallbackQueueInterface[2])
                          (pCVar4,&local_70,
                           info.
                           super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
                if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
                }
              }
              psVar11 = local_58;
              if (des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (des.
                           super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
                psVar11 = local_58;
              }
            }
          }
          psVar13 = psVar13 + 1;
        } while (psVar13 != psVar11);
      }
      pthread_mutex_unlock(local_60);
      __mutex = local_b0;
    }
    if (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (info.
                 super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pthread_mutex_unlock(__mutex);
  }
  return (bool)((byte)local_b4 ^ 1);
}

Assistant:

bool Subscription::addCallback(const SubscriptionCallbackHelperPtr& helper, const std::string& md5sum,
  CallbackQueueInterface* queue, int32_t queue_size, const VoidConstPtr& tracked_object, bool allow_concurrent_callbacks)
{
  MINIROS_ASSERT(helper);
  MINIROS_ASSERT(queue);


  // Decay to a real type as soon as we have a subscriber with a real type
  {
    std::scoped_lock<std::mutex> lock(md5sum_mutex_);
    if (md5sum_ == "*" && md5sum != "*")
    {

      md5sum_ = md5sum;
    }
  }

  if (md5sum != "*" && md5sum != this->md5sum())
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(callbacks_mutex_);

    CallbackInfoPtr info(std::make_shared<CallbackInfo>());
    info->helper_ = helper;
    info->callback_queue_ = queue;
    info->subscription_queue_ = std::make_shared<SubscriptionQueue>(name_, queue_size, allow_concurrent_callbacks);
    info->tracked_object_ = tracked_object;
    info->has_tracked_object_ = false;
    if (tracked_object)
    {
      info->has_tracked_object_ = true;
    }

    if (!helper->isConst())
    {
      ++nonconst_callbacks_;
    }

    callbacks_.push_back(info);
    cached_deserializers_.reserve(callbacks_.size());

    // if we have any latched links, we need to immediately schedule callbacks
    if (!latched_messages_.empty())
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

      for (const PublisherLinkPtr& link: publisher_links_)
      {
        if (!link->isLatched())
          continue;

        auto des_it = latched_messages_.find(link);
        if (des_it == latched_messages_.end())
          continue;

        const LatchInfo& latch_info = des_it->second;
        auto des = std::make_shared<MessageDeserializer>(helper, latch_info.message, latch_info.connection_header);
        bool was_full = false;
        info->subscription_queue_->push(info->helper_, des, info->has_tracked_object_, info->tracked_object_, true, latch_info.receipt_time, &was_full);
        if (!was_full)
        {
          info->callback_queue_->addCallback(info->subscription_queue_, (uint64_t)info.get());
        }
      }
    }
  }

  return true;
}